

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcPrsNode * __thiscall CTcParser::create_sym_node(CTcParser *this,textchar_t *sym,size_t sym_len)

{
  CTcPrsDbgSymtab *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  CTPNSymDebugLocalBase *this_00;
  undefined *puVar4;
  CTcPrsSymtab *curtab;
  CTcPrsSymtab *pCVar5;
  tcprsdbg_sym_info info;
  tcprsdbg_sym_info tStack_38;
  long *plVar3;
  
  pCVar5 = this->local_symtab_;
  do {
    iVar2 = (*pCVar5->_vptr_CTcPrsSymtab[2])(pCVar5,sym,sym_len);
    plVar3 = (long *)CONCAT44(extraout_var,iVar2);
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x78))(plVar3);
      if (pCVar5 != this->global_symtab_) {
        this_00 = (CTPNSymDebugLocalBase *)CTcPrsMem::alloc(G_prsmem,0x10);
        *(long **)&this_00->var_id_ = plVar3;
        puVar4 = &CTPNSymResolved::vtable;
        goto LAB_0022a95f;
      }
      break;
    }
    pCVar5 = pCVar5->parent_;
  } while (pCVar5 != (CTcPrsSymtab *)0x0);
  pCVar1 = this->debug_symtab_;
  if ((pCVar1 == (CTcPrsDbgSymtab *)0x0) ||
     (iVar2 = (*(code *)**(undefined8 **)pCVar1)(pCVar1,sym,sym_len,&tStack_38), iVar2 == 0)) {
    this->self_referenced_ = 1;
    this_00 = (CTPNSymDebugLocalBase *)CTcPrsMem::alloc(G_prsmem,0x18);
    *(textchar_t **)&this_00->var_id_ = sym;
    *(size_t *)&this_00->frame_idx_ = sym_len;
    puVar4 = &CTPNSym::vtable;
  }
  else {
    this_00 = (CTPNSymDebugLocalBase *)CTcPrsMem::alloc(G_prsmem,0x18);
    CTPNSymDebugLocalBase::CTPNSymDebugLocalBase(this_00,&tStack_38);
    puVar4 = &CTPNSymDebugLocal::vtable;
  }
LAB_0022a95f:
  (this_00->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       (_func_int **)(puVar4 + 0x10);
  return &this_00->super_CTcPrsNode;
}

Assistant:

CTcPrsNode *CTcParser::create_sym_node(const textchar_t *sym, size_t sym_len)
{
    /* 
     *   First, look up the symbol in local scope.  Local scope symbols
     *   can always be resolved during parsing, because the language
     *   requires that local scope items be declared before their first
     *   use. 
     */
    CTcPrsSymtab *symtab;
    CTcSymbol *entry = local_symtab_->find(sym, sym_len, &symtab);

    /* if we found it in local scope, return a resolved symbol node */
    if (entry != 0 && symtab != global_symtab_)
        return new CTPNSymResolved(entry);

    /* if there's a debugger local scope, look it up there */
    if (debug_symtab_ != 0)
    {
        /* look it up in the debug symbol table */
        tcprsdbg_sym_info info;
        if (debug_symtab_->find_symbol(sym, sym_len, &info))
        {
            /* found it - return a debugger local variable */
            return new CTPNSymDebugLocal(&info);
        }
    }

    /* 
     *   We didn't find it in local scope, so the symbol cannot be resolved
     *   until code generation - return an unresolved symbol node.  Note a
     *   possible implicit self-reference, since this could be a property of
     *   'self'.  
     */
    set_self_referenced(TRUE);
    return new CTPNSym(sym, sym_len);
}